

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

void Cgt_ManDetectCandidates_rec
               (Aig_Man_t *pAig,Vec_Int_t *vUseful,Aig_Obj_t *pObj,int nLevelMax,Vec_Ptr_t *vCands)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vCands_local;
  int nLevelMax_local;
  Aig_Obj_t *pObj_local;
  Vec_Int_t *vUseful_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 != 0) {
      pAVar2 = Aig_ObjFanin0(pObj);
      Cgt_ManDetectCandidates_rec(pAig,vUseful,pAVar2,nLevelMax,vCands);
      pAVar2 = Aig_ObjFanin1(pObj);
      Cgt_ManDetectCandidates_rec(pAig,vUseful,pAVar2,nLevelMax,vCands);
    }
    iVar1 = Aig_ObjLevel(pObj);
    if (iVar1 <= nLevelMax) {
      if (vUseful != (Vec_Int_t *)0x0) {
        iVar1 = Aig_ObjId(pObj);
        iVar1 = Vec_IntEntry(vUseful,iVar1);
        if (iVar1 == 0) {
          return;
        }
      }
      Vec_PtrPush(vCands,pObj);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes transitive fanout cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cgt_ManDetectCandidates_rec( Aig_Man_t * pAig, Vec_Int_t * vUseful, Aig_Obj_t * pObj, int nLevelMax, Vec_Ptr_t * vCands )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin0(pObj), nLevelMax, vCands );
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin1(pObj), nLevelMax, vCands );
    }
    if ( Aig_ObjLevel(pObj) <= nLevelMax && (vUseful == NULL || Vec_IntEntry(vUseful, Aig_ObjId(pObj))) )
        Vec_PtrPush( vCands, pObj );
}